

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetSelectLinker::cmTargetSelectLinker(cmTargetSelectLinker *this,cmTarget *target)

{
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar1;
  
  this->Preference = 0;
  this->Target = target;
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hash_set(&this->Preferred);
  this_00 = this->Target->Makefile;
  this->Makefile = this_00;
  pcVar1 = cmMakefile::GetGlobalGenerator(this_00);
  this->GG = pcVar1;
  return;
}

Assistant:

cmTargetSelectLinker(cmTarget const* target): Preference(0), Target(target)
    {
    this->Makefile = this->Target->GetMakefile();
    this->GG = this->Makefile->GetGlobalGenerator();
    }